

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall cmGlobalGenerator::AddMakefile(cmGlobalGenerator *this,cmMakefile *mf)

{
  pointer *pppcVar1;
  iterator __position;
  cmState *this_00;
  int iVar2;
  char *__nptr;
  float prog;
  float fVar3;
  cmMakefile *local_48;
  string local_40;
  
  __position._M_current =
       (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48 = mf;
  if (__position._M_current ==
      (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmMakefile*,std::allocator<cmMakefile*>>::_M_realloc_insert<cmMakefile*const&>
              ((vector<cmMakefile*,std::allocator<cmMakefile*>> *)&this->Makefiles,__position,
               &local_48);
  }
  else {
    *__position._M_current = mf;
    pppcVar1 = &(this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  this_00 = this->CMakeInstance->State;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"CMAKE_NUMBER_OF_MAKEFILES","");
  __nptr = cmState::GetInitializedCacheValue(this_00,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (__nptr == (char *)0x0) {
    fVar3 = (1.0 - this->FirstTimeProgress) / 30.0 + this->FirstTimeProgress;
    prog = 0.95;
    if (fVar3 <= 0.95) {
      prog = fVar3;
    }
    this->FirstTimeProgress = prog;
  }
  else {
    iVar2 = atoi(__nptr);
    fVar3 = ((float)(ulong)((long)(this->Makefiles).
                                  super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->Makefiles).
                                  super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 3) * 0.9) /
            (float)iVar2;
    prog = 0.9;
    if (fVar3 <= 0.9) {
      prog = fVar3;
    }
  }
  cmake::UpdateProgress(this->CMakeInstance,"Configuring",prog);
  return;
}

Assistant:

void cmGlobalGenerator::AddMakefile(cmMakefile *mf)
{
  this->Makefiles.push_back(mf);

  // update progress
  // estimate how many lg there will be
  const char *numGenC =
    this->CMakeInstance->GetState()->GetInitializedCacheValue
    ("CMAKE_NUMBER_OF_MAKEFILES");

  if (!numGenC)
    {
    // If CMAKE_NUMBER_OF_MAKEFILES is not set
    // we are in the first time progress and we have no
    // idea how long it will be.  So, just move half way
    // there each time, and don't go over 95%
    this->FirstTimeProgress += ((1.0f - this->FirstTimeProgress) /30.0f);
    if(this->FirstTimeProgress > 0.95f)
      {
      this->FirstTimeProgress = 0.95f;
      }
    this->CMakeInstance->UpdateProgress("Configuring",
                                        this->FirstTimeProgress);
    return;
    }

  int numGen = atoi(numGenC);
  float prog = 0.9f*static_cast<float>(this->Makefiles.size())/
    static_cast<float>(numGen);
  if (prog > 0.9f)
    {
    prog = 0.9f;
    }
  this->CMakeInstance->UpdateProgress("Configuring", prog);
}